

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_gej_clear(secp256k1_gej *r)

{
  r->infinity = 0;
  (r->x).magnitude = 0;
  (r->x).normalized = 1;
  (r->x).n[0] = 0;
  (r->x).n[1] = 0;
  (r->x).n[2] = 0;
  (r->x).n[3] = 0;
  (r->x).n[4] = 0;
  secp256k1_fe_verify(&r->x);
  (r->y).magnitude = 0;
  (r->y).normalized = 1;
  (r->y).n[0] = 0;
  (r->y).n[1] = 0;
  (r->y).n[2] = 0;
  (r->y).n[3] = 0;
  (r->y).n[4] = 0;
  secp256k1_fe_verify(&r->y);
  (r->z).magnitude = 0;
  (r->z).normalized = 1;
  (r->z).n[0] = 0;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  secp256k1_fe_verify(&r->z);
  secp256k1_gej_verify(r);
  return;
}

Assistant:

static void secp256k1_gej_clear(secp256k1_gej *r) {
    r->infinity = 0;
    secp256k1_fe_clear(&r->x);
    secp256k1_fe_clear(&r->y);
    secp256k1_fe_clear(&r->z);

    SECP256K1_GEJ_VERIFY(r);
}